

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::handle_append_entries_resp(raft_server *this,resp_msg *resp)

{
  char cVar1;
  int32 iVar2;
  int32 iVar3;
  ulong uVar4;
  element_type *peVar5;
  element_type *peVar6;
  peer *this_00;
  context *pcVar7;
  element_type *peVar8;
  buffer *buf;
  int iVar9;
  ulong uVar10;
  undefined4 extraout_var;
  __int_type _Var11;
  undefined4 extraout_var_00;
  uint64_t uVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _func_int__Any_data_ptr *__tmp_2;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  ulong uVar13;
  char *pcVar14;
  uint uVar15;
  _Hash_node_base *p_Var16;
  _func_int **pp_Var17;
  char *pcVar18;
  __node_base_ptr p_Var19;
  __node_base_ptr p_Var20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var21;
  bool bVar22;
  bool bVar23;
  ptr<req_msg> req;
  ptr<resp_appendix> appendix;
  uint64_t new_matched_idx;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  log_val_type local_a2;
  undefined1 local_a1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  value_type local_98;
  Type local_7c;
  _func_int **local_78;
  custom_notification_msg local_70;
  ptr<peer> local_58;
  ptr<peer> local_48;
  element_type *local_38;
  
  iVar9 = (resp->super_msg_base).src_;
  uVar4 = (this->peers_)._M_h._M_bucket_count;
  uVar13 = (ulong)(long)iVar9 % uVar4;
  p_Var19 = (this->peers_)._M_h._M_buckets[uVar13];
  p_Var20 = (__node_base_ptr)0x0;
  if ((p_Var19 != (__node_base_ptr)0x0) &&
     (p_Var16 = p_Var19->_M_nxt, p_Var20 = p_Var19, iVar9 != *(int *)&p_Var19->_M_nxt[1]._M_nxt)) {
    while (p_Var19 = p_Var16, p_Var16 = p_Var19->_M_nxt, p_Var16 != (_Hash_node_base *)0x0) {
      p_Var20 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var16[1]._M_nxt % uVar4 != uVar13) ||
         (p_Var20 = p_Var19, iVar9 == *(int *)&p_Var16[1]._M_nxt)) goto LAB_001c69fc;
    }
    p_Var20 = (__node_base_ptr)0x0;
  }
LAB_001c69fc:
  if (p_Var20 == (__node_base_ptr)0x0) {
    p_Var16 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var16 = p_Var20->_M_nxt;
  }
  if (p_Var16 == (_Hash_node_base *)0x0) {
    peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar6 == (element_type *)0x0) {
      return;
    }
    iVar9 = (*peVar6->_vptr_logger[7])();
    if (iVar9 < 4) {
      return;
    }
    peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              ((string *)local_c8,"the response is from an unknown peer %d",
               (ulong)(uint)(resp->super_msg_base).src_);
    (*peVar6->_vptr_logger[8])
              (peVar6,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
               ,"handle_append_entries_resp",0x3bd,local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._0_8_ == &local_b8) {
      return;
    }
    operator_delete((void *)local_c8._0_8_);
    return;
  }
  check_srv_to_leave_timeout(this);
  peVar5 = (this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if ((((peVar5 != (element_type *)0x0) &&
       (((peVar5->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        )->id_ == (resp->super_msg_base).src_)) &&
      (((peVar5->stepping_down_)._M_base._M_i & 1U) != 0)) &&
     (this->srv_to_leave_target_idx_ < resp->next_idx_)) {
    peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar6 != (element_type *)0x0) && (iVar9 = (*peVar6->_vptr_logger[7])(), 3 < iVar9)) {
      peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_c8,
                 "server to be removed %d fully caught up the target config log %lu",
                 (ulong)(uint)((((this->srv_to_leave_).
                                 super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                )->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_,this->srv_to_leave_target_idx_);
      (*peVar6->_vptr_logger[8])
                (peVar6,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"handle_append_entries_resp",0x3ca,local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._0_8_ != &local_b8) {
        operator_delete((void *)local_c8._0_8_);
      }
    }
    remove_peer_from_peers(this,&this->srv_to_leave_);
    reset_srv_to_leave(this);
    return;
  }
  this_00 = (peer *)p_Var16[2]._M_nxt;
  p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var16[3]._M_nxt;
  if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
    }
  }
  peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_a0 = p_Var21;
  if ((peVar6 != (element_type *)0x0) && (iVar9 = (*peVar6->_vptr_logger[7])(), 5 < iVar9)) {
    peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              ((string *)local_c8,"handle append entries resp (from %d), resp.get_next_idx(): %lu",
               (ulong)(uint)((this_00->config_).
                             super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->id_,resp->next_idx_);
    (*peVar6->_vptr_logger[8])
              (peVar6,6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
               ,"handle_append_entries_resp",0x3d6,local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._0_8_ != &local_b8) {
      operator_delete((void *)local_c8._0_8_);
    }
  }
  pp_Var17 = (_func_int **)resp->next_batch_size_hint_in_bytes_;
  peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar6 != (element_type *)0x0) && (iVar9 = (*peVar6->_vptr_logger[7])(), 5 < iVar9)) {
    peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              ((string *)local_c8,"peer %d batch size hint: %ld bytes",
               (ulong)(uint)((this_00->config_).
                             super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->id_,pp_Var17);
    (*peVar6->_vptr_logger[8])
              (peVar6,6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
               ,"handle_append_entries_resp",0x3d9,local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._0_8_ != &local_b8) {
      operator_delete((void *)local_c8._0_8_);
    }
  }
  LOCK();
  (this_00->next_batch_size_hint_in_bytes_).super___atomic_base<long>._M_i =
       (__int_type_conflict3)pp_Var17;
  UNLOCK();
  local_78 = pp_Var17;
  if (resp->accepted_ == true) {
    local_70.type_ = 0;
    local_70._4_4_ = 0;
    iVar9 = pthread_mutex_lock((pthread_mutex_t *)&this_00->lock_);
    if (iVar9 != 0) {
      std::__throw_system_error(iVar9);
    }
    LOCK();
    (this_00->next_log_idx_).super___atomic_base<unsigned_long>._M_i = resp->next_idx_;
    UNLOCK();
    uVar10 = this_00->matched_idx_;
    local_70._0_8_ = resp->next_idx_ - 1;
    peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar6 != (element_type *)0x0) && (iVar9 = (*peVar6->_vptr_logger[7])(), 5 < iVar9)) {
      peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_c8,"peer %d, prev matched idx: %lu, new matched idx: %lu",
                 (ulong)(uint)((this_00->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_,uVar10,local_70._0_8_);
      (*peVar6->_vptr_logger[8])
                (peVar6,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"handle_append_entries_resp",0x3e5,local_c8);
      p_Var21 = local_a0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._0_8_ != &local_b8) {
        operator_delete((void *)local_c8._0_8_);
      }
    }
    this_00->matched_idx_ = local_70._0_8_;
    LOCK();
    (this_00->last_accepted_log_idx_).super___atomic_base<unsigned_long>._M_i = local_70._0_8_;
    UNLOCK();
    pthread_mutex_unlock((pthread_mutex_t *)&this_00->lock_);
    pp_Var17 = local_78;
    local_c8._4_4_ = (this->leader_).super___atomic_base<int>._M_i;
    local_c8._0_4_ = this->id_;
    local_c8._8_4_ =
         ((this_00->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->id_;
    pcVar7 = (this->ctx_)._M_t.
             super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
             super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
             super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
    local_b8._M_allocated_capacity = (size_type)&local_70;
    if ((pcVar7->cb_func_).func.super__Function_base._M_manager != (_Manager_type)0x0) {
      local_7c = GotAppendEntryRespFromPeer;
      local_98.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_c8;
      (*(pcVar7->cb_func_).func._M_invoker)
                ((_Any_data *)&pcVar7->cb_func_,&local_7c,(Param **)&local_98);
    }
    uVar10 = get_expected_committed_log_idx(this);
    commit(this,uVar10);
    bVar22 = true;
    LOCK();
    bVar23 = (this_00->pending_commit_flag_)._M_base._M_i == true;
    if (bVar23) {
      (this_00->pending_commit_flag_)._M_base._M_i = false;
    }
    UNLOCK();
    if (!bVar23) {
      uVar4 = resp->next_idx_;
      iVar9 = (*((this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      bVar22 = uVar4 < CONCAT44(extraout_var,iVar9);
    }
  }
  else {
    local_70.ctx_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this_00->lock_;
    iVar9 = pthread_mutex_lock((pthread_mutex_t *)
                               local_70.ctx_.
                               super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
    if (iVar9 != 0) {
      std::__throw_system_error(iVar9);
    }
    uVar4 = (this_00->next_log_idx_).super___atomic_base<unsigned_long>._M_i;
    _Var11 = resp->next_idx_;
    if ((_Var11 == 0) || (uVar4 <= _Var11)) {
      peVar8 = (resp->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var21 = (resp->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
        }
      }
      if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
      }
      if (peVar8 == (element_type *)0x0) {
        bVar22 = true;
      }
      else {
        buf = (resp->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var21 = (resp->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
          }
        }
        resp_appendix::deserialize((resp_appendix *)&local_98,buf);
        if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
        }
        bVar22 = (char)(local_98.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->term_ != '\x01';
        if ((handle_append_entries_resp(nuraft::resp_msg&)::extra_order_timer == '\0') &&
           (iVar9 = __cxa_guard_acquire(&handle_append_entries_resp(nuraft::resp_msg&)::
                                         extra_order_timer), iVar9 != 0)) {
          handle_append_entries_resp::extra_order_timer.t_created_.__d.__r = (duration)0;
          handle_append_entries_resp::extra_order_timer.duration_us_ = 1000000;
          handle_append_entries_resp::extra_order_timer.first_event_fired_ = false;
          handle_append_entries_resp::extra_order_timer.lock_.super___mutex_base._M_mutex.__align =
               0;
          handle_append_entries_resp::extra_order_timer.lock_.super___mutex_base._M_mutex._8_8_ = 0;
          handle_append_entries_resp::extra_order_timer.lock_.super___mutex_base._M_mutex._16_8_ = 0
          ;
          handle_append_entries_resp::extra_order_timer.lock_.super___mutex_base._M_mutex.__data.
          __list.__prev = (__pthread_internal_list *)0x0;
          handle_append_entries_resp::extra_order_timer.lock_.super___mutex_base._M_mutex.__data.
          __list.__next = (__pthread_internal_list *)0x0;
          timer_helper::reset(&handle_append_entries_resp::extra_order_timer);
          __cxa_guard_release(&handle_append_entries_resp(nuraft::resp_msg&)::extra_order_timer);
        }
        bVar23 = timer_helper::timeout_and_reset(&handle_append_entries_resp::extra_order_timer);
        peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar6 != (element_type *)0x0) {
          iVar9 = (*peVar6->_vptr_logger[7])();
          uVar15 = (uint)!bVar23 * 2 + 4;
          if ((int)uVar15 <= iVar9) {
            local_38 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
            cVar1 = (char)(local_98.
                           super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->term_;
            pcVar18 = "UNKNOWN";
            if (cVar1 == '\x01') {
              pcVar18 = "DO_NOT_REWIND";
            }
            pcVar14 = "NONE";
            if (cVar1 != '\0') {
              pcVar14 = pcVar18;
            }
            msg_if_given_abi_cxx11_((string *)local_c8,"received extra order: %s",pcVar14);
            (*local_38->_vptr_logger[8])
                      (local_38,(ulong)uVar15,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                       ,"handle_append_entries_resp",0x407,local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._0_8_ != &local_b8) {
              operator_delete((void *)local_c8._0_8_);
            }
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT44(local_98.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._4_4_,
                     local_98.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
           ) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT44(local_98.
                              super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi._4_4_,
                              local_98.
                              super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi._0_4_));
        }
      }
      if ((uVar4 != 0) && (bVar22)) {
        _Var11 = uVar4 - 1;
        goto LAB_001c6fa5;
      }
    }
    else {
LAB_001c6fa5:
      LOCK();
      (this_00->next_log_idx_).super___atomic_base<unsigned_long>._M_i = _Var11;
      UNLOCK();
    }
    LOCK();
    bVar22 = (this_00->suppress_following_error_)._M_base._M_i == true;
    if (bVar22) {
      (this_00->suppress_following_error_)._M_base._M_i = false;
    }
    UNLOCK();
    if ((handle_append_entries_resp(nuraft::resp_msg&)::log_timer == '\0') &&
       (iVar9 = __cxa_guard_acquire(&handle_append_entries_resp(nuraft::resp_msg&)::log_timer),
       iVar9 != 0)) {
      handle_append_entries_resp::log_timer.t_created_.__d.__r = (duration)0;
      handle_append_entries_resp::log_timer.duration_us_ = 500000;
      handle_append_entries_resp::log_timer.first_event_fired_ = false;
      handle_append_entries_resp::log_timer.lock_.super___mutex_base._M_mutex.__align = 0;
      handle_append_entries_resp::log_timer.lock_.super___mutex_base._M_mutex._8_8_ = 0;
      handle_append_entries_resp::log_timer.lock_.super___mutex_base._M_mutex._16_8_ = 0;
      handle_append_entries_resp::log_timer.lock_.super___mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      handle_append_entries_resp::log_timer.lock_.super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      timer_helper::reset(&handle_append_entries_resp::log_timer);
      __cxa_guard_release(&handle_append_entries_resp(nuraft::resp_msg&)::log_timer);
    }
    p_Var21 = local_a0;
    uVar15 = 4;
    if (!bVar22) {
      bVar22 = timer_helper::timeout_and_reset(&handle_append_entries_resp::log_timer);
      uVar15 = (uint)!bVar22 + (uint)!bVar22 * 2 + 3;
    }
    peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar6 != (element_type *)0x0) &&
       (iVar9 = (*peVar6->_vptr_logger[7])(), (int)uVar15 <= iVar9)) {
      peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_c8,
                 "declined append: peer %d, prev next log idx %lu, resp next %lu, new next log idx %lu"
                 ,(ulong)(uint)((this_00->config_).
                                super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->id_,uVar4,resp->next_idx_,
                 (this_00->next_log_idx_).super___atomic_base<unsigned_long>._M_i);
      (*peVar6->_vptr_logger[8])
                (peVar6,(ulong)uVar15,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"handle_append_entries_resp",0x41d,local_c8);
      p_Var21 = local_a0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._0_8_ != &local_b8) {
        operator_delete((void *)local_c8._0_8_);
      }
    }
    pthread_mutex_unlock
              ((pthread_mutex_t *)
               local_70.ctx_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    bVar22 = true;
    pp_Var17 = local_78;
  }
  uVar10 = this_00->matched_idx_;
  if (((this->write_paused_)._M_base._M_i & 1U) != 0) {
    if (((uVar10 != 0) &&
        (((this_00->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->id_ == (this->next_leader_candidate_).super___atomic_base<int>._M_i)) &&
       (iVar9 = (*((this->log_store_).
                   super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_log_store[2])(), uVar10 == CONCAT44(extraout_var_00,iVar9) - 1U)) {
      LOCK();
      bVar23 = (this_00->busy_flag_)._M_base._M_i == false;
      if (bVar23) {
        (this_00->busy_flag_)._M_base._M_i = true;
      }
      UNLOCK();
      if (bVar23) {
        peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar6 != (element_type *)0x0) && (iVar9 = (*peVar6->_vptr_logger[7])(), 3 < iVar9)) {
          peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar15 = (this->next_leader_candidate_).super___atomic_base<int>._M_i;
          uVar12 = timer_helper::get_us(&this->reelection_timer_);
          msg_if_given_abi_cxx11_
                    ((string *)local_c8,
                     "ready to resign, server id %d, latest log index %lu, %lu us elapsed, resign now"
                     ,(ulong)uVar15,uVar10,uVar12);
          (*peVar6->_vptr_logger[8])
                    (peVar6,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"handle_append_entries_resp",0x433,local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._0_8_ != &local_b8) {
            operator_delete((void *)local_c8._0_8_);
          }
        }
        LOCK();
        (this->leader_).super___atomic_base<int>._M_i = -1;
        UNLOCK();
        local_98.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ._0_4_ = 0;
        local_98.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ._4_4_ = 0;
        local_c8._0_8_ = *(undefined8 *)&(this->rand_timeout_).super__Function_base._M_functor;
        local_c8._8_8_ =
             *(undefined8 *)((long)&(this->rand_timeout_).super__Function_base._M_functor + 8);
        *(raft_server **)&(this->rand_timeout_).super__Function_base._M_functor = this;
        *(undefined4 *)((long)&(this->rand_timeout_).super__Function_base._M_functor + 8) = 0;
        *(undefined4 *)((long)&(this->rand_timeout_).super__Function_base._M_functor + 0xc) = 0;
        local_b8._M_allocated_capacity =
             (size_type)(this->rand_timeout_).super__Function_base._M_manager;
        (this->rand_timeout_).super__Function_base._M_manager =
             std::
             _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx:1080:25)>
             ::_M_manager;
        local_b8._8_8_ = (this->rand_timeout_)._M_invoker;
        (this->rand_timeout_)._M_invoker =
             std::
             _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx:1080:25)>
             ::_M_invoke;
        local_98.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this;
        if ((custom_notification_msg *)local_b8._M_allocated_capacity !=
            (custom_notification_msg *)0x0) {
          (*(code *)local_b8._M_allocated_capacity)(local_c8,local_c8,3);
        }
        become_follower(this);
        update_rand_timeout(this);
        LOCK();
        (this->hb_alive_)._M_base._M_i = false;
        UNLOCK();
        _Var11 = (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
        iVar2 = ((this_00->config_).
                 super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_;
        iVar9 = (*((this->log_store_).
                   super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_log_store[2])();
        local_78 = (_func_int **)term_for_log(this,CONCAT44(extraout_var_01,iVar9) - 1);
        iVar9 = (*((this->log_store_).
                   super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_log_store[2])();
        pp_Var17 = (_func_int **)(this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i
        ;
        local_c8._0_8_ = (element_type *)0x0;
        local_c8._8_8_ = operator_new(0x60);
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_)->_M_use_count = 1;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_)->_M_weak_count = 1;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_)->_vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_005c84e0;
        local_c8._0_8_ = local_c8._8_8_ + 0x10;
        iVar3 = this->id_;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._8_8_ + 0x10))->_M_use_count =
             (int)_Var11;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._8_8_ + 0x10))->_M_weak_count =
             (int)(_Var11 >> 0x20);
        *(undefined4 *)
         &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._8_8_ + 0x20))->
          _vptr__Sp_counted_base = 0x1c;
        *(int32 *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._8_8_ + 0x20))
                          ->_vptr__Sp_counted_base + 4) = iVar3;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._8_8_ + 0x20))->_M_use_count =
             iVar2;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._8_8_ + 0x10))->
        _vptr__Sp_counted_base = (_func_int **)&PTR__req_msg_005c8530;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._8_8_ + 0x30))->
        _vptr__Sp_counted_base = local_78;
        *(long *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._8_8_ + 0x30))->
                  _M_use_count = CONCAT44(extraout_var_02,iVar9) + -1;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._8_8_ + 0x40))->
        _vptr__Sp_counted_base = pp_Var17;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._8_8_ + 0x40))->_M_use_count = 0;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._8_8_ + 0x40))->_M_weak_count = 0
        ;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._8_8_ + 0x50))->
        _vptr__Sp_counted_base = (_func_int **)0x0;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._8_8_ + 0x50))->_M_use_count = 0;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._8_8_ + 0x50))->_M_weak_count = 0
        ;
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
        p_Var21 = local_a0;
        this_01->_M_use_count = 1;
        this_01->_M_weak_count = 1;
        this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c86f8;
        *(undefined4 *)&this_01[1]._vptr__Sp_counted_base = 2;
        this_01[1]._M_use_count = 0;
        this_01[1]._M_weak_count = 0;
        this_01[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        local_7c = 0;
        custom_notification_msg::serialize(&local_70);
        local_a2 = custom;
        local_98.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,int,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
                  (&local_98.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(log_entry **)&local_98,(allocator<nuraft::log_entry> *)&local_a1,
                   (int *)&local_7c,(shared_ptr<nuraft::buffer> *)&local_70,&local_a2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_70.ctx_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_70.ctx_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
        }
        std::
        vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
        ::push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     *)(local_c8._0_8_ + 0x38),&local_98);
        local_48.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var21;
        if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
          }
        }
        local_48.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
        peer::send_req(this_00,&local_48,(ptr<req_msg> *)local_c8,&this->resp_handler_);
        if (local_48.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT44(local_98.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._4_4_,
                     local_98.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
           ) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT44(local_98.
                              super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi._4_4_,
                              local_98.
                              super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi._0_4_));
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
        }
        goto LAB_001c7488;
      }
    }
  }
  if ((this->role_)._M_i == leader) {
    if ((bool)(-1 < (long)pp_Var17 & bVar22)) {
      peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar6 != (element_type *)0x0) && (iVar9 = (*peVar6->_vptr_logger[7])(), 4 < iVar9)) {
        peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_c8,"reqeust append entries need to catchup, p %d\n",
                   (ulong)(uint)((this_00->config_).
                                 super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->id_);
        (*peVar6->_vptr_logger[8])
                  (peVar6,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"handle_append_entries_resp",0x467,local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._0_8_ != &local_b8) {
          operator_delete((void *)local_c8._0_8_);
        }
      }
      if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
        }
      }
      local_58.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
      local_58.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Var21;
      request_append_entries(this,&local_58);
      if (local_58.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
    bVar22 = timer_helper::timeout_and_reset(&this->status_check_timer_);
    if (bVar22) {
      check_overall_status(this);
    }
  }
LAB_001c7488:
  if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
  }
  return;
}

Assistant:

void raft_server::handle_append_entries_resp(resp_msg& resp) {
    peer_itor it = peers_.find(resp.get_src());
    if (it == peers_.end()) {
        p_in("the response is from an unknown peer %d", resp.get_src());
        return;
    }

    check_srv_to_leave_timeout();
    if ( srv_to_leave_ &&
         srv_to_leave_->get_id() == resp.get_src() &&
         srv_to_leave_->is_stepping_down() &&
         resp.get_next_idx() > srv_to_leave_target_idx_ ) {
        // Catch-up is done.
        p_in("server to be removed %d fully caught up the "
             "target config log %" PRIu64,
             srv_to_leave_->get_id(),
             srv_to_leave_target_idx_);
        remove_peer_from_peers(srv_to_leave_);
        reset_srv_to_leave();
        return;
    }

    // If there are pending logs to be synced or commit index need to be advanced,
    // continue to send appendEntries to this peer
    bool need_to_catchup = true;

    ptr<peer> p = it->second;
    p_tr("handle append entries resp (from %d), resp.get_next_idx(): %" PRIu64,
         (int)p->get_id(), resp.get_next_idx());

    int64 bs_hint = resp.get_next_batch_size_hint_in_bytes();
    p_tr("peer %d batch size hint: %" PRId64 " bytes", p->get_id(), bs_hint);
    p->set_next_batch_size_hint_in_bytes(bs_hint);

    if (resp.get_accepted()) {
        uint64_t prev_matched_idx = 0;
        uint64_t new_matched_idx = 0;
        {
            std::lock_guard<std::mutex> l(p->get_lock());
            p->set_next_log_idx(resp.get_next_idx());
            prev_matched_idx = p->get_matched_idx();
            new_matched_idx = resp.get_next_idx() - 1;
            p_tr("peer %d, prev matched idx: %" PRIu64 ", new matched idx: %" PRIu64,
                 p->get_id(), prev_matched_idx, new_matched_idx);
            p->set_matched_idx(new_matched_idx);
            p->set_last_accepted_log_idx(new_matched_idx);
        }
        cb_func::Param param(id_, leader_, p->get_id());
        param.ctx = &new_matched_idx;
        CbReturnCode rc = ctx_->cb_func_.call
                          ( cb_func::GotAppendEntryRespFromPeer, &param );
        (void)rc;

        // Try to commit with this response.
        ulong committed_index = get_expected_committed_log_idx();
        commit( committed_index );
        need_to_catchup = p->clear_pending_commit() ||
                          resp.get_next_idx() < log_store_->next_slot();

    } else {
        std::lock_guard<std::mutex> guard(p->get_lock());
        ulong prev_next_log = p->get_next_log_idx();
        if (resp.get_next_idx() > 0 && prev_next_log > resp.get_next_idx()) {
            // fast move for the peer to catch up
            p->set_next_log_idx(resp.get_next_idx());
        } else {
            bool do_log_rewind = true;
            // If not, check an extra order exists.
            if (resp.get_ctx()) {
                ptr<resp_appendix> appendix = resp_appendix::deserialize(*resp.get_ctx());
                if (appendix->extra_order_ == resp_appendix::DO_NOT_REWIND) {
                    do_log_rewind = false;
                }

                static timer_helper extra_order_timer(1000 * 1000, true);
                int log_lv = extra_order_timer.timeout_and_reset() ? L_INFO : L_TRACE;
                p_lv(log_lv, "received extra order: %s",
                     resp_appendix::extra_order_msg(appendix->extra_order_));
            }
            // if not, move one log backward.
            // WARNING: Make sure that `next_log_idx_` shouldn't be smaller than 0.
            if (do_log_rewind && prev_next_log) {
                p->set_next_log_idx(prev_next_log - 1);
            }
        }
        bool suppress = p->need_to_suppress_error();

        // To avoid verbose logs here.
        static timer_helper log_timer(500 * 1000, true);
        int log_lv = suppress ? L_INFO : L_WARN;
        if (log_lv == L_WARN) {
            if (!log_timer.timeout_and_reset()) {
                log_lv = L_TRACE;
            }
        }
        p_lv( log_lv,
              "declined append: peer %d, prev next log idx %" PRIu64 ", "
              "resp next %" PRIu64 ", new next log idx %" PRIu64,
              p->get_id(), prev_next_log,
              resp.get_next_idx(), p->get_next_log_idx() );
    }

    // NOTE:
    //   If all other followers are not responding, we may not make
    //   below condition true. In that case, we check the timeout of
    //   re-election timer in heartbeat handler, and do force resign.
    ulong p_matched_idx = p->get_matched_idx();
    if ( write_paused_ &&
         p->get_id() == next_leader_candidate_ &&
         p_matched_idx &&
         p_matched_idx == log_store_->next_slot() - 1 &&
         p->make_busy() ) {
        // NOTE:
        //   If `make_busy` fails (very unlikely to happen), next
        //   response handler (of heartbeat, append_entries ..) will
        //   retry this.
        p_in("ready to resign, server id %d, "
             "latest log index %" PRIu64 ", "
             "%" PRIu64 " us elapsed, resign now",
             next_leader_candidate_.load(),
             p_matched_idx,
             reelection_timer_.get_us());
        leader_ = -1;

        // To avoid this node becomes next leader again, set timeout
        // value bigger than any others, just once at this time.
        rand_timeout_ = [this]() -> int32 {
            return this->ctx_->get_params()->election_timeout_upper_bound_ +
                   this->ctx_->get_params()->election_timeout_lower_bound_;
        };
        become_follower();
        update_rand_timeout();

        // Clear live flag to avoid pre-vote rejection.
        hb_alive_ = false;

        // Send leadership takeover request to this follower.
        ptr<req_msg> req = cs_new<req_msg>
                           ( state_->get_term(),
                             msg_type::custom_notification_request,
                             id_, p->get_id(),
                             term_for_log(log_store_->next_slot() - 1),
                             log_store_->next_slot() - 1,
                             quick_commit_index_.load() );

        // Create a notification.
        ptr<custom_notification_msg> custom_noti =
            cs_new<custom_notification_msg>
            ( custom_notification_msg::leadership_takeover );

        // Wrap it using log_entry.
        ptr<log_entry> custom_noti_le =
            cs_new<log_entry>(0, custom_noti->serialize(), log_val_type::custom);

        req->log_entries().push_back(custom_noti_le);
        p->send_req(p, req, resp_handler_);
        return;
    }

    if (bs_hint < 0) {
        // If hint is a negative number, we should set `need_to_catchup`
        // to `false` to avoid sending meaningless messages continuously
        // which eats up CPU. Then the leader will send heartbeats only.
        need_to_catchup = false;
    }

    // This may not be a leader anymore,
    // such as the response was sent out long time ago
    // and the role was updated by UpdateTerm call
    // Try to match up the logs for this peer
    if (role_ == srv_role::leader) {
        if (need_to_catchup) {
            p_db("reqeust append entries need to catchup, p %d\n",
                 (int)p->get_id());
            request_append_entries(p);
        }
        if (status_check_timer_.timeout_and_reset()) {
            check_overall_status();
        }
    }
}